

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,char c)

{
  ulong uVar1;
  code *pcVar2;
  char *pcVar3;
  bool bVar4;
  size_t sVar5;
  size_t len_;
  basic_substring<char> bVar6;
  basic_substring<char> local_20;
  
  pcVar3 = this->str;
  if (this->str != (char *)0x0 && this->len != 0) {
    sVar5 = last_not_of(this,c,0xffffffffffffffff);
    if (sVar5 != 0xffffffffffffffff) {
      len_ = sVar5 + 1;
      uVar1 = this->len;
      if (len_ != 0xffffffffffffffff && uVar1 <= sVar5) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            bVar6 = (basic_substring<char>)(*pcVar2)();
            return bVar6;
          }
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (len_ == 0xffffffffffffffff) {
        len_ = uVar1;
      }
      if (uVar1 < len_) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            bVar6 = (basic_substring<char>)(*pcVar2)();
            return bVar6;
          }
        }
        handle_error(0x22b919,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_20,this->str,len_);
      goto LAB_0021ad75;
    }
    pcVar3 = this->str;
  }
  local_20.str = pcVar3;
  local_20.len = 0;
LAB_0021ad75:
  bVar6.len = local_20.len;
  bVar6.str = local_20.str;
  return bVar6;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }